

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clone.cpp
# Opt level: O1

void __thiscall Clone_resetWithMath_Test::TestBody(Clone_resetWithMath_Test *this)

{
  string *psVar1;
  ResetPtr r;
  ResetPtr rClone;
  string *local_40;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_38;
  long *local_30;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_28;
  long local_20 [2];
  
  libcellml::Reset::create();
  psVar1 = local_40;
  local_30 = local_20;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_30,"unique","");
  libcellml::Entity::setId(psVar1);
  if (local_30 != local_20) {
    operator_delete(local_30,local_20[0] + 1);
  }
  libcellml::Reset::setOrder((int)local_40);
  libcellml::Reset::setTestValue(local_40);
  libcellml::Reset::setResetValue(local_40);
  libcellml::Reset::clone();
  compareReset((shared_ptr *)&local_40,(shared_ptr *)&local_30);
  if (local_28 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_28);
  }
  if (local_38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38);
  }
  return;
}

Assistant:

TEST(Clone, resetWithMath)
{
    auto r = libcellml::Reset::create();
    r->setId("unique");
    r->setOrder(32);
    r->setTestValue(NON_EMPTY_MATH);
    r->setResetValue(EMPTY_MATH);

    auto rClone = r->clone();

    compareReset(r, rClone);
}